

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_delete_all(planck_unit_test_t *tc)

{
  int iVar1;
  uint uVar2;
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  int local_98;
  uint local_94;
  uint local_90;
  int local_8c;
  ion_dictionary_t local_88;
  ion_dictionary_handler_t local_70;
  
  bhdct_setup(tc,&local_70,&local_88,ion_fill_edge_cases);
  iVar1 = 0;
  do {
    local_8c = iVar1;
    bhdct_delete(tc,&local_88,&local_8c,'\0',1,'\x01');
    iVar1 = iVar1 + 1;
  } while (iVar1 != 10);
  uVar2 = 0x30;
  do {
    uVar2 = uVar2 + 2;
    local_90 = uVar2;
    bhdct_delete(tc,&local_88,&local_90,'\0',1,'\x01');
  } while (uVar2 < 0x62);
  uVar2 = 0x1ef;
  do {
    uVar2 = uVar2 + 5;
    local_94 = uVar2;
    bhdct_delete(tc,&local_88,&local_94,'\0',1,'\x01');
  } while (uVar2 < 0x3e3);
  iVar1 = -0x66;
  do {
    iVar1 = iVar1 + 2;
    local_98 = iVar1;
    bhdct_delete(tc,&local_88,&local_98,'\0',1,'\x01');
  } while (iVar1 < -0x34);
  bhdct_delete_dictionary(tc,&local_88);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_delete_all(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;

	bhdct_setup(tc, &handler, &dict, ion_fill_edge_cases);

	int i;

	ION_FILL_LOW_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}
	ION_FILL_MEDIUM_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}
	ION_FILL_HIGH_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}
	ION_FILL_EDGE_LOOP(i) {
		bhdct_delete(tc, &dict, IONIZE(i, int), err_ok, 1, boolean_true);
	}

	bhdct_takedown(tc, &dict);
}